

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O1

void ClearHuffmanTreeIfOnlyOneSymbol(HuffmanTreeCode *huffman_code)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  
  if (0 < (long)huffman_code->num_symbols) {
    lVar3 = 0;
    bVar1 = false;
    do {
      bVar2 = bVar1;
      if ((huffman_code->code_lengths[lVar3] != '\0') && (bVar2 = true, bVar1)) {
        return;
      }
      bVar1 = bVar2;
      lVar3 = lVar3 + 1;
    } while (huffman_code->num_symbols != lVar3);
  }
  if (0 < huffman_code->num_symbols) {
    lVar3 = 0;
    do {
      huffman_code->code_lengths[lVar3] = '\0';
      huffman_code->codes[lVar3] = 0;
      lVar3 = lVar3 + 1;
    } while (lVar3 < huffman_code->num_symbols);
  }
  return;
}

Assistant:

static void ClearHuffmanTreeIfOnlyOneSymbol(
    HuffmanTreeCode* const huffman_code) {
  int k;
  int count = 0;
  for (k = 0; k < huffman_code->num_symbols; ++k) {
    if (huffman_code->code_lengths[k] != 0) {
      ++count;
      if (count > 1) return;
    }
  }
  for (k = 0; k < huffman_code->num_symbols; ++k) {
    huffman_code->code_lengths[k] = 0;
    huffman_code->codes[k] = 0;
  }
}